

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)

{
  uint uVar1;
  jx9_user_func *pjVar2;
  anon_union_8_3_18420de5_for_x *pObj;
  anon_union_8_3_18420de5_for_x nId;
  unqlite_kv_engine *puVar3;
  unqlite_kv_methods *puVar4;
  _func_void_unqlite_kv_cursor_ptr *p_Var5;
  void *pvVar6;
  sxi32 sVar7;
  int iVar8;
  unqlite_col *pCol;
  char *pcVar9;
  int iFlag;
  jx9_value *pjVar10;
  anon_union_8_3_18420de5_for_x aVar11;
  jx9_vm *pVm;
  unqlite_kv_cursor *pCursor;
  unqlite *pDb;
  int nByte;
  SyString sName;
  uint local_84;
  SyString local_80;
  anon_union_8_3_18420de5_for_x local_70;
  undefined8 local_68;
  jx9_vm *pjStack_60;
  jx9_vm *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (argc < 2) {
    pjVar2 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar9 = "Missing collection name and/or records";
LAB_0011850c:
    jx9VmThrowError(pVm,&pjVar2->sName,1,pcVar9);
  }
  else {
    pcVar9 = jx9_value_to_string(*argv,(int *)&local_84);
    if ((int)local_84 < 1) {
      pjVar2 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar9 = "Invalid collection name";
      goto LAB_0011850c;
    }
    local_80.nByte = local_84;
    local_80.zString = pcVar9;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_80,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      pObj = &argv[1]->x;
      jx9MemObjToInteger((jx9_value *)pObj);
      nId = (anon_union_8_3_18420de5_for_x)pObj->iVal;
      pjVar10 = argv[2];
      if (((pjVar10->iFlags & 0x40) != 0) &&
         ((((jx9_hashmap *)(pjVar10->x).pOther)->iFlags & 1) == 0)) {
        sVar7 = jx9HashmapWalk((jx9_hashmap *)(pjVar10->x).pOther,CollectionRecordArrayWalker,pCol);
        aVar11.iVal._1_7_ = 0;
        aVar11.iVal._0_1_ = sVar7 == 0;
        goto LAB_00118660;
      }
      pDb = pCol->pVm->pDb;
      if (pCol->nTotRec == 0x7fffffffffffffff) {
        pcVar9 = "Collection \'%z\': Records limit reached";
LAB_00118654:
        aVar11.rVal = 0.0;
        unqliteGenErrorFormat(pDb,pcVar9,&pCol->sName);
      }
      else {
        puVar3 = ((pDb->sDB).pPager)->pEngine;
        puVar4 = puVar3->pIo->pMethods;
        if (puVar4->xReplace ==
            (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
          pcVar9 = 
          "Cannot store record into collection \'%z\' due to a read-only Key/Value storage engine";
          goto LAB_00118654;
        }
        (pCol->sWorker).nByte = 0;
        uVar1 = (pCol->sWorker).nFlags;
        if ((uVar1 & 4) != 0) {
          (pCol->sWorker).pBlob = (void *)0x0;
          (pCol->sWorker).mByte = 0;
          (pCol->sWorker).nFlags = uVar1 & 0xfffffffb;
        }
        SyBlobFormat(&pCol->sWorker,"%z_%qd",&pCol->sName,nId.rVal);
        pCursor = pCol->pCursor;
        p_Var5 = pCursor->pStore->pIo->pMethods->xReset;
        if (p_Var5 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
          (*p_Var5)(pCursor);
          pCursor = pCol->pCursor;
        }
        iVar8 = unqlite_kv_cursor_seek(pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
        if (iVar8 != 0) {
          pDb = pCol->pVm->pDb;
          pcVar9 = "No record to update in collection \'%z\'";
          goto LAB_00118654;
        }
        if (((pjVar10->iFlags & 0x40) != 0) && ((*(byte *)((pjVar10->x).iVal + 0x40) & 1) != 0)) {
          pjStack_60 = pCol->pVm->pJx9Vm;
          uStack_40 = 0;
          local_38 = 0;
          uStack_50 = 0;
          local_48 = 0;
          local_68 = 2;
          local_70 = nId;
          local_58 = pjStack_60;
          jx9_array_add_strkey_elem(pjVar10,"__id",(jx9_value *)&local_70);
          jx9MemObjRelease((jx9_value *)&local_70);
        }
        uVar1 = (pCol->sWorker).nByte;
        if ((ulong)uVar1 == 0) {
          unqliteGenError(pCol->pVm->pDb,"unQLite is running out of memory");
          aVar11.rVal = 0.0;
        }
        else {
          aVar11.rVal = 0.0;
          sVar7 = FastJsonEncode(pjVar10,&pCol->sWorker,0);
          if (sVar7 == 0) {
            pvVar6 = (pCol->sWorker).pBlob;
            iVar8 = (*puVar4->xReplace)(puVar3,pvVar6,uVar1,(void *)((ulong)uVar1 + (long)pvVar6),
                                        (ulong)((pCol->sWorker).nByte - uVar1));
            if (iVar8 != 0) {
              pDb = pCol->pVm->pDb;
              pcVar9 = "IO error while storing record into collection \'%z\'";
              goto LAB_00118654;
            }
            CollectionCacheInstallRecord(pCol,nId.iVal,pjVar10);
            aVar11.rVal = 4.94065645841247e-324;
          }
        }
      }
LAB_00118660:
      pjVar10 = pCtx->pRet;
      jx9MemObjRelease(pjVar10);
      pjVar10->x = aVar11;
      goto LAB_00118529;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&local_80);
  }
  pjVar10 = pCtx->pRet;
  jx9MemObjRelease(pjVar10);
  (pjVar10->x).rVal = 0.0;
LAB_00118529:
  pjVar10->iFlags = pjVar10->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)
{
    unqlite_col *pCol;
    const char *zName;
    unqlite_vm *pVm;
    SyString sName;
    jx9_int64 nId;
    int nByte;
    int rc;
    /* Extract collection name */
    if( argc < 2 ){
        /* Missing arguments */
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    zName = jx9_value_to_string(argv[0],&nByte);
    if( nByte < 1){
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    SyStringInitFromBuf(&sName,zName,nByte);
    pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
    /* Fetch the collection */
    pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
    if( pCol == 0 ){
        jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    /* Update a record with the given value */
    nId = jx9_value_to_int64(argv[1]);
    rc = unqliteCollectionUpdateRecord(pCol, nId, argv[2], 0);
    /* All done, return TRUE */
    jx9_result_bool(pCtx,rc == UNQLITE_OK);
    return JX9_OK;
}